

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fsave_x86_64(CPUX86State *env,target_ulong ptr,int data32)

{
  floatx80 f;
  uintptr_t unaff_retaddr;
  int local_34;
  int i;
  floatx80 tmp;
  target_ulong tStack_18;
  int data32_local;
  target_ulong ptr_local;
  CPUX86State *env_local;
  
  do_fstenv(env,ptr,data32,unaff_retaddr);
  tStack_18 = (long)(0xe << ((byte)data32 & 0x1f)) + ptr;
  for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
    f._10_6_ = 0;
    f._0_10_ = *(unkuint10 *)(env->fpregs + (env->fpstt + local_34 & 7));
    helper_fstt(env,f,tStack_18,unaff_retaddr);
    tStack_18 = tStack_18 + 10;
  }
  do_fninit(env);
  return;
}

Assistant:

void helper_fsave(CPUX86State *env, target_ulong ptr, int data32)
{
    floatx80 tmp;
    int i;

    do_fstenv(env, ptr, data32, GETPC());

    ptr += (14 << data32);
    for (i = 0; i < 8; i++) {
        tmp = ST(i);
        helper_fstt(env, tmp, ptr, GETPC());
        ptr += 10;
    }

    do_fninit(env);
}